

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  undefined1 uVar1;
  string *psVar2;
  int iVar3;
  int iVar4;
  Cord *local_40;
  void *local_38 [2];
  
  local_38[0] = (void *)0x0;
  local_40 = output;
  psVar2 = absl::lts_20240722::log_internal::
           Check_NEImpl<absl::lts_20240722::Cord*,decltype(nullptr)>
                     (&local_40,local_38,"output != nullptr");
  if (psVar2 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x133,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38)
    ;
  }
  if (size < 0) {
    absl::lts_20240722::Cord::Clear();
  }
  else {
    if (((uint)size < 0x200) || (*(long *)(this + 0x10) == 0)) {
      iVar4 = *(int *)(this + 8) - (int)*(undefined8 *)this;
      iVar3 = size;
      if (iVar4 < size) {
        iVar3 = iVar4;
      }
      absl::lts_20240722::Cord::operator=(local_40,(long)iVar3);
      *(long *)this = *(long *)this + (long)iVar3;
      if (size <= iVar4) {
        return true;
      }
      if (*(long *)(this + 0x10) == 0) {
        return false;
      }
      iVar4 = *(int *)(this + 0x1c) + *(int *)(this + 0x2c);
      if (iVar4 != 0 && SCARRY4(*(int *)(this + 0x1c),*(int *)(this + 0x2c)) == iVar4 < 0) {
        return false;
      }
      size = size - iVar3;
    }
    else {
      absl::lts_20240722::Cord::Clear();
      BackUpInputToCurrentPosition(this);
    }
    iVar3 = *(int *)(this + 0x28);
    if (*(int *)(this + 0x30) < *(int *)(this + 0x28)) {
      iVar3 = *(int *)(this + 0x30);
    }
    if (size <= iVar3 - *(int *)(this + 0x18)) {
      *(int *)(this + 0x18) = *(int *)(this + 0x18) + size;
      uVar1 = (**(code **)(**(long **)(this + 0x10) + 0x30))(*(long **)(this + 0x10),local_40,size);
      return (bool)uVar1;
    }
    *(int *)(this + 0x18) = iVar3;
    (**(code **)(**(long **)(this + 0x10) + 0x30))(*(long **)(this + 0x10),local_40);
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (PROTOBUF_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}